

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgzip.c
# Opt level: O2

FT_Error FT_Gzip_Uncompress(FT_Memory memory,FT_Byte *output,FT_ULong *output_len,FT_Byte *input,
                           FT_ULong input_len)

{
  int iVar1;
  FT_Error FVar2;
  z_stream stream;
  
  stream.avail_in = (uInt)input_len;
  FVar2 = 6;
  if (((output != (FT_Byte *)0x0) && (memory != (FT_Memory)0x0)) && (output_len != (FT_ULong *)0x0))
  {
    stream.avail_out = (uInt)*output_len;
    stream.zalloc = ft_gzip_alloc;
    stream.zfree = ft_gzip_free;
    stream.next_in = input;
    stream.next_out = output;
    stream.opaque = memory;
    iVar1 = inflateInit2_(&stream,0x2f,"1.2.11",0x70);
    if (iVar1 == 0) {
      iVar1 = inflate(&stream,4);
      if (iVar1 == 1) {
        *output_len = stream.total_out;
        iVar1 = inflateEnd(&stream);
      }
      else {
        inflateEnd(&stream);
        if (iVar1 == 0) {
          return 10;
        }
      }
      FVar2 = 0;
      if (iVar1 + 5U < 8) {
        FVar2 = *(FT_Error *)(&DAT_002c2c68 + (ulong)(iVar1 + 5U) * 4);
      }
    }
  }
  return FVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Gzip_Uncompress( FT_Memory       memory,
                      FT_Byte*        output,
                      FT_ULong*       output_len,
                      const FT_Byte*  input,
                      FT_ULong        input_len )
  {
    z_stream  stream;
    int       err;


    /* check for `input' delayed to `inflate' */

    if ( !memory || !output_len || !output )
      return FT_THROW( Invalid_Argument );

    /* this function is modeled after zlib's `uncompress' function */

    stream.next_in  = (Bytef*)input;
    stream.avail_in = (uInt)input_len;

    stream.next_out  = output;
    stream.avail_out = (uInt)*output_len;

    stream.zalloc = ft_gzip_alloc;
    stream.zfree  = ft_gzip_free;
    stream.opaque = memory;

    err = inflateInit2( &stream, MAX_WBITS|32 );

    if ( err != Z_OK )
      return FT_THROW( Invalid_Argument );

    err = inflate( &stream, Z_FINISH );
    if ( err != Z_STREAM_END )
    {
      inflateEnd( &stream );
      if ( err == Z_OK )
        err = Z_BUF_ERROR;
    }
    else
    {
      *output_len = stream.total_out;

      err = inflateEnd( &stream );
    }

    if ( err == Z_MEM_ERROR )
      return FT_THROW( Out_Of_Memory );

    if ( err == Z_BUF_ERROR )
      return FT_THROW( Array_Too_Large );

    if ( err == Z_DATA_ERROR )
      return FT_THROW( Invalid_Table );

    if ( err == Z_NEED_DICT )
      return FT_THROW( Invalid_Table );

    return FT_Err_Ok;
  }